

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_6_integer(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  int base;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_intf(&G->data,PVIP_NODE_INT,yytext,(long)yyleng,
                              (int)(G->val[-1]->field_2).iv);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_6_integer(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define i G->val[-1]
  yyprintf((stderr, "do yy_6_integer"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        int base = i->iv;\n\
        yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, base);\n\
    }\n"));
  
        int base = i->iv;
        yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, base);
    ;
#undef i
}